

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_TestShell::createTest
          (TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
                                  ,0x2d9);
  TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_Test::
  TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_Test
            ((TEST_MockSupport_c_failureWithParameterOfTypeCoversValueToString_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockSupport_c, failureWithParameterOfTypeCoversValueToString)
{
    TestTestingFixture fixture;
    mock_c()->installComparator("typeName", typeNameIsEqual, typeNameValueToString);
    fixture.setTestFunction(failingCallToMockCWithParameterOfType_);
    fixture.runAllTests();
    fixture.assertPrintContains("typeName name: <valueToString>");
    mock_c()->removeAllComparatorsAndCopiers();
}